

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student_t_dist.hpp
# Opt level: O1

result_type_conflict2 __thiscall
trng::student_t_dist<double>::cdf(student_t_dist<double> *this,result_type_conflict2 x)

{
  double dVar1;
  double x_00;
  double norm;
  
  dVar1 = x * x + (double)(this->P).nu_;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  x_00 = (double)(this->P).nu_ * 0.5;
  norm = math::detail::Beta<double>(x_00,x_00);
  dVar1 = math::detail::Beta_I<double>((x + dVar1) / (dVar1 + dVar1),x_00,x_00,norm);
  return dVar1;
}

Assistant:

cdf(result_type x) const {
      const result_type t1{+math::sqrt(x * x + P.nu())};
      const result_type t2{(x + t1) / (2 * t1)};
      return math::Beta_I(t2, P.nu() / result_type(2), P.nu() / result_type(2));
    }